

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O1

complex<float> csign2(complex<float> z1,complex<float> z2)

{
  complex<float> in_RAX;
  _ComplexT_conflict extraout_RAX;
  _ComplexT_conflict extraout_RAX_00;
  _ComplexT_conflict extraout_RAX_01;
  float in_XMM0_Da;
  float in_XMM0_Db;
  double __x;
  double dVar1;
  float in_XMM1_Da;
  float in_XMM1_Db;
  
  __x = (double)in_XMM1_Db * (double)in_XMM1_Db + (double)in_XMM1_Da * (double)in_XMM1_Da;
  if (__x < 0.0) {
    dVar1 = sqrt(__x);
    in_RAX._M_value = extraout_RAX;
  }
  else {
    dVar1 = SQRT(__x);
  }
  if (((float)dVar1 != 0.0) || (NAN((float)dVar1))) {
    dVar1 = (double)in_XMM0_Db * (double)in_XMM0_Db + (double)in_XMM0_Da * (double)in_XMM0_Da;
    if (dVar1 < 0.0) {
      sqrt(dVar1);
      in_RAX._M_value = extraout_RAX_00;
    }
    if (__x < 0.0) {
      sqrt(__x);
      in_RAX._M_value = extraout_RAX_01;
    }
  }
  return (complex<float>)in_RAX._M_value;
}

Assistant:

complex <float> csign2 ( complex <float> z1, complex <float> z2 )

//****************************************************************************80
//
//  Purpose:
//
//    CSIGN2 is a transfer-of-sign function.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    The L2 norm is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, complex <float> Z1, Z2, the arguments.
//
//    Output, complex <float> CSIGN2,  a complex value, with the magnitude of
//    Z1, and the argument of Z2.
//
{
  complex <float> value;

  if ( cabs2 ( z2 ) == 0.0 )
  {
    value = complex <float> ( 0.0, 0.0 );
  }
  else
  {
    value = cabs2 ( z1 ) * ( z2 / cabs2 ( z2 ) );
  }

  return value;
}